

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::FboTestUtil::TextureCubeArrayShader::TextureCubeArrayShader
          (TextureCubeArrayShader *this,DataType samplerType,DataType outputType,
          GLSLVersion glslVersion)

{
  ShaderProgramDeclaration *pSVar1;
  InternalError *this_00;
  char *pcVar2;
  allocator<char> local_50d;
  allocator<char> local_50c;
  allocator<char> local_50b;
  allocator<char> local_50a;
  allocator<char> local_509;
  allocator<char> local_508;
  allocator<char> local_507;
  allocator<char> local_506;
  allocator<char> local_505;
  FragmentOutput local_504;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  FragmentSource local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  VertexSource local_360;
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  VertexToFragmentVarying local_260;
  Uniform local_258;
  Uniform local_230;
  Uniform local_208;
  Uniform local_1e0;
  Uniform local_1b8;
  VertexAttribute local_190;
  VertexAttribute local_168;
  ShaderProgramDeclaration local_140;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  std::__cxx11::string::string<std::allocator<char>>(local_280,"a_position",&local_505);
  std::__cxx11::string::string((string *)&local_168,local_280);
  local_168.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_168);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"a_coord",&local_506);
  std::__cxx11::string::string((string *)&local_190,local_2a0);
  local_190.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_190);
  local_260.type = GENERICVECTYPE_FLOAT;
  local_260.flatshade = false;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_260);
  if (outputType == TYPE_FLOAT_VEC4) {
    local_504.type = GENERICVECTYPE_FLOAT;
  }
  else if (outputType == TYPE_UINT_VEC4) {
    local_504.type = GENERICVECTYPE_UINT32;
  }
  else if (outputType == TYPE_INT_VEC4) {
    local_504.type = GENERICVECTYPE_INT32;
  }
  else {
    local_504.type = GENERICVECTYPE_LAST;
  }
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_504);
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"u_coordMat",&local_507);
  std::__cxx11::string::string((string *)&local_1b8,local_2c0);
  local_1b8.type = TYPE_FLOAT_MAT3;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"u_sampler0",&local_508);
  std::__cxx11::string::string((string *)&local_1e0,local_2e0);
  local_1e0.type = samplerType;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>(local_300,"u_scale",&local_509);
  std::__cxx11::string::string((string *)&local_208,local_300);
  local_208.type = TYPE_FLOAT_VEC4;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_208);
  std::__cxx11::string::string<std::allocator<char>>(local_320,"u_bias",&local_50a);
  std::__cxx11::string::string((string *)&local_230,local_320);
  local_230.type = TYPE_FLOAT_VEC4;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_230);
  std::__cxx11::string::string<std::allocator<char>>(local_340,"u_layer",&local_50b);
  std::__cxx11::string::string((string *)&local_258,local_340);
  local_258.type = TYPE_INT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_258);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,glcts::fixed_sample_locations_values + 1,&local_50c);
  pcVar2 = "#version 320 es\n";
  if (glslVersion == GLSL_VERSION_310_ES) {
    pcVar2 = "#version 310 es\n#extension GL_EXT_texture_cube_map_array : require\n";
  }
  std::operator+(&local_3a0,&local_3c0,pcVar2);
  std::operator+(&local_380,&local_3a0,
                 "in highp vec4 a_position;\nin mediump vec2 a_coord;\nuniform mat3 u_coordMat;\nout highp vec3 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = u_coordMat * vec3(a_coord, 1.0);\n}\n"
                );
  std::__cxx11::string::string((string *)&local_360,(string *)&local_380);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_360);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,glcts::fixed_sample_locations_values + 1,&local_50d);
  std::operator+(&local_4e0,&local_500,pcVar2);
  std::operator+(&local_4c0,&local_4e0,"uniform highp ");
  pcVar2 = glu::getDataTypeName(samplerType);
  std::operator+(&local_4a0,&local_4c0,pcVar2);
  std::operator+(&local_480,&local_4a0,
                 " u_sampler0;\nuniform highp vec4 u_scale;\nuniform highp vec4 u_bias;\nuniform highp int u_layer;\nin highp vec3 v_coord;\nlayout(location = 0) out highp "
                );
  pcVar2 = glu::getDataTypeName(outputType);
  std::operator+(&local_460,&local_480,pcVar2);
  std::operator+(&local_440,&local_460," o_color;\nvoid main (void)\n{\n\to_color = ");
  pcVar2 = glu::getDataTypeName(outputType);
  std::operator+(&local_420,&local_440,pcVar2);
  std::operator+(&local_400,&local_420,
                 "(vec4(texture(u_sampler0, vec4(v_coord, u_layer))) * u_scale + u_bias);\n}\n");
  std::__cxx11::string::string((string *)&local_3e0,(string *)&local_400);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_3e0);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string(local_280);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e56070;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e560a8;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e560c0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&(this->super_ShaderProgram).field_0x154,1.0);
  tcu::Vector<float,_4>::Vector(&this->m_texBias,0.0);
  this->m_layer = 0;
  tcu::Matrix<float,_3,_3>::Matrix(&this->m_coordMat);
  this->m_outputType = outputType;
  if ((glslVersion & ~GLSL_VERSION_300_ES) != GLSL_VERSION_310_ES) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,(char *)0x0,
               "glslVersion == glu::GLSL_VERSION_310_ES || glslVersion == glu::GLSL_VERSION_320_ES",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboTestUtil.cpp"
               ,0x138);
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

TextureCubeArrayShader::TextureCubeArrayShader (glu::DataType samplerType, glu::DataType outputType, glu::GLSLVersion glslVersion)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
							<< sglr::pdec::Uniform("u_coordMat", glu::TYPE_FLOAT_MAT3)
							<< sglr::pdec::Uniform("u_sampler0", samplerType)
							<< sglr::pdec::Uniform("u_scale", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_bias", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_layer", glu::TYPE_INT)
							<< sglr::pdec::VertexSource(
									string("") +
									((glslVersion == glu::GLSL_VERSION_310_ES) ?
									"#version 310 es\n"
									"#extension GL_EXT_texture_cube_map_array : require\n"
									 : "#version 320 es\n") +
									"in highp vec4 a_position;\n"
									"in mediump vec2 a_coord;\n"
									"uniform mat3 u_coordMat;\n"
									"out highp vec3 v_coord;\n"
									"void main (void)\n"
									"{\n"
									"	gl_Position = a_position;\n"
									"	v_coord = u_coordMat * vec3(a_coord, 1.0);\n"
									"}\n")
							<< sglr::pdec::FragmentSource(
									string("") +
									((glslVersion == glu::GLSL_VERSION_310_ES) ?
									"#version 310 es\n"
									"#extension GL_EXT_texture_cube_map_array : require\n"
									 : "#version 320 es\n") +
									"uniform highp " + glu::getDataTypeName(samplerType) + " u_sampler0;\n"
									"uniform highp vec4 u_scale;\n"
									"uniform highp vec4 u_bias;\n"
									"uniform highp int u_layer;\n"
									"in highp vec3 v_coord;\n"
									"layout(location = 0) out highp " + glu::getDataTypeName(outputType) + " o_color;\n"
									"void main (void)\n"
									"{\n"
									"	o_color = " + glu::getDataTypeName(outputType) + "(vec4(texture(u_sampler0, vec4(v_coord, u_layer))) * u_scale + u_bias);\n"
									"}\n"))
	, m_texScale	(1.0f)
	, m_texBias		(0.0f)
	, m_layer		(0)
	, m_outputType	(outputType)
{
	TCU_CHECK_INTERNAL(glslVersion == glu::GLSL_VERSION_310_ES || glslVersion == glu::GLSL_VERSION_320_ES);
}